

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::registerdirblock(ImgfsFile *this,uint64_t ofs)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  mapped_type *pmVar5;
  undefined8 *puVar6;
  uint fileblocknr;
  
  uVar1 = (this->_hdr).bytesperblock;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = ofs;
  auVar4 = auVar4 / ZEXT416(uVar1);
  if (auVar4._0_8_ >> 0x20 == 0) {
    fileblocknr = auVar4._0_4_;
    puVar2 = (this->_dir2file).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (this->_dir2file).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pmVar5 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->_file2dir,&fileblocknr);
    *pmVar5 = (mapped_type)((ulong)((long)puVar2 - (long)puVar3) >> 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->_dir2file,&fileblocknr);
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8,ofs,ofs % (ulong)uVar1);
  *puVar6 = "registerdirblock: offset too large";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void registerdirblock(uint64_t ofs)
    {
        if ((ofs/_hdr.bytesperblock)>>32)
            throw "registerdirblock: offset too large";
        unsigned fileblocknr= unsigned(ofs/_hdr.bytesperblock);

        _file2dir[fileblocknr]= _dir2file.size();
        _dir2file.push_back(fileblocknr);
    }